

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

ssize_t __thiscall
Json::BuiltStyledStreamWriter::write(BuiltStyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  undefined4 in_register_00000034;
  Value *root;
  
  root = (Value *)CONCAT44(in_register_00000034,__fd);
  (this->super_StreamWriter).sout_ = (ostream *)__buf;
  this->field_0xd8 = this->field_0xd8 & 0xfc | 2;
  std::__cxx11::string::_M_replace
            ((ulong)&this->indentString_,0,(char *)(this->indentString_)._M_string_length,0x1513fd);
  writeCommentBeforeValue(this,root);
  bVar1 = this->field_0xd8;
  if ((bVar1 & 2) == 0) {
    writeIndent(this);
    bVar1 = this->field_0xd8;
  }
  this->field_0xd8 = bVar1 | 2;
  writeValue(this,root);
  writeCommentAfterValueOnSameLine(this,root);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamWriter).sout_,(this->endingLineFeedSymbol_)._M_dataplus._M_p,
             (this->endingLineFeedSymbol_)._M_string_length);
  (this->super_StreamWriter).sout_ = (ostream *)0x0;
  return 0;
}

Assistant:

int BuiltStyledStreamWriter::write(Value const& root, std::ostream* sout)
{
  sout_ = sout;
  addChildValues_ = false;
  indented_ = true;
  indentString_ = "";
  writeCommentBeforeValue(root);
  if (!indented_) writeIndent();
  indented_ = true;
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *sout_ << endingLineFeedSymbol_;
  sout_ = NULL;
  return 0;
}